

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.hpp
# Opt level: O2

void __thiscall OpenMD::CubicSpline::~CubicSpline(CubicSpline *this)

{
  ~CubicSpline(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

virtual ~CubicSpline() {}